

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O2

type jsoncons::detail::
     decode_base64_generic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char),std::__cxx11::string>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,uint8_t *reverse_alphabet,_func_bool_char *f,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  uint8_t uVar1;
  undefined6 uVar2;
  undefined7 uVar3;
  uint8_t uVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  undefined8 in_RAX;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  type tVar13;
  undefined5 uStack_38;
  uint8_t a4 [4];
  uint8_t a3 [3];
  
  _uStack_38 = in_RAX;
  do {
    uVar10 = 0;
    do {
      uVar11 = _uStack_38;
      uVar12 = uVar10 & 0xff;
      if (first._M_current == last._M_current) {
LAB_00225db5:
        if ((char)uVar10 == '\0') {
          uVar11 = 0;
        }
        else {
          for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
            a4[uVar10] = reverse_alphabet[a4[uVar10]];
          }
          uVar1 = a4[1];
          bVar7 = a4[0] << 2;
          bVar6 = a4[1] >> 4;
          _uStack_38 = CONCAT15(bVar6 & 3 | bVar7,uStack_38);
          uVar2 = _uStack_38;
          a4[2] = SUB81(uVar11,3);
          a3[2] = SUB81(uVar11,7);
          _uStack_38 = CONCAT16(a4[2] >> 2 & 0xf | uVar1 << 4,uVar2);
          uVar11 = 0;
          for (uVar10 = 0; (int)uVar12 - 1 != uVar10; uVar10 = uVar10 + 1) {
            std::__cxx11::string::push_back((char)result);
          }
        }
LAB_00225e2a:
        tVar13._8_8_ = uVar11;
        tVar13.it._M_current = last._M_current;
        return tVar13;
      }
      if (*first._M_current == '=') goto LAB_00225db5;
      bVar5 = (*f)(*first._M_current);
      uVar11 = _uStack_38;
      if (!bVar5) {
        uVar11 = 1;
        last._M_current = first._M_current;
        goto LAB_00225e2a;
      }
      uVar1 = *first._M_current;
      first._M_current = first._M_current + 1;
      uVar8 = (int)uVar12 + 1;
      uVar10 = (ulong)uVar8;
      a4[uVar12] = uVar1;
    } while ((char)uVar8 != '\x04');
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      a4[lVar9] = reverse_alphabet[a4[lVar9]];
    }
    uVar1 = a4[1];
    bVar6 = a4[0] << 2;
    bVar7 = a4[1] >> 4;
    _uStack_38 = CONCAT15(bVar7 & 3 | bVar6,uStack_38);
    uVar2 = _uStack_38;
    a4[2] = SUB81(uVar11,3);
    uVar4 = a4[2];
    _uStack_38 = CONCAT16(a4[2] >> 2 & 0xf | uVar1 << 4,uVar2);
    uVar3 = _uStack_38;
    a4[3] = SUB81(uVar11,4);
    _uStack_38 = CONCAT17(uVar4 * '@' + a4[3],uVar3);
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      std::__cxx11::string::push_back((char)result);
    }
  } while( true );
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base64_generic(InputIt first, InputIt last, 
                          const uint8_t reverse_alphabet[256],
                          F f,
                          Container& result)
    {
        uint8_t a4[4], a3[3];
        uint8_t i = 0;
        uint8_t j = 0;

        while (first != last && *first != '=')
        {
            if (!f(*first))
            {
                return decode_result<InputIt>{first, conv_errc::conversion_failed};
            }

            a4[i++] = static_cast<uint8_t>(*first++); 
            if (i == 4)
            {
                for (i = 0; i < 4; ++i) 
                {
                    a4[i] = reverse_alphabet[a4[i]];
                }

                a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
                a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);
                a3[2] = ((a4[2] & 0x3) << 6) +   a4[3];

                for (i = 0; i < 3; i++) 
                {
                    result.push_back(a3[i]);
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = 0; j < i; ++j) 
            {
                a4[j] = reverse_alphabet[a4[j]];
            }

            a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
            a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);

            for (j = 0; j < i - 1; ++j) 
            {
                result.push_back(a3[j]);
            }
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }